

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_writers.h
# Opt level: O2

void cppwinrt::write_forward(writer *w,TypeDef *type)

{
  bool bVar1;
  category cVar2;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  type_name type_name;
  anon_class_8_1_89897ddb_conflict2 local_100;
  undefined1 local_f8 [32];
  basic_string_view<char,_std::char_traits<char>_> local_d8;
  pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> generics;
  TypeSig local_a8;
  
  cppwinrt::type_name::type_name(&type_name,type);
  cVar2 = winmd::reader::get_category(type);
  if (cVar2 == enum_type) {
    local_d8._M_str = "    enum class % : %;\n";
    local_d8._M_len = 0x16;
    winmd::reader::TypeDef::FieldList
              ((pair<winmd::reader::Field,_winmd::reader::Field> *)local_f8,type);
    winmd::reader::Field::Signature((FieldSig *)&generics,(Field *)local_f8);
    writer_base<cppwinrt::writer>::
    write_segment<std::basic_string_view<char,std::char_traits<char>>,winmd::reader::TypeSig>
              (&w->super_writer_base<cppwinrt::writer>,&local_d8,&type_name.name,&local_a8);
    winmd::reader::FieldSig::~FieldSig((FieldSig *)&generics);
  }
  else {
    generics.first.super_row_base<winmd::reader::GenericParam>.m_table = (table_base *)0x1b;
    generics.first.super_row_base<winmd::reader::GenericParam>._8_8_ = anon_var_dwarf_9f9da;
    bVar1 = operator==(&type_name,(string_view *)&generics);
    if (!bVar1) {
      local_f8._0_8_ = (table_base *)0x1b;
      local_f8._8_8_ = "Windows.Foundation.TimeSpan";
      bVar1 = operator==(&type_name,(string_view *)local_f8);
      if (!bVar1) {
        __y._M_str = "Windows.Foundation.Numerics";
        __y._M_len = 0x1b;
        bVar1 = std::operator==(type_name.name_space,__y);
        if (bVar1) {
          __y_00._M_str = "Matrix3x2";
          __y_00._M_len = 9;
          bVar1 = std::operator==(type_name.name,__y_00);
          if (bVar1) {
            return;
          }
          __y_01._M_str = "Matrix4x4";
          __y_01._M_len = 9;
          bVar1 = std::operator==(type_name.name,__y_01);
          if (bVar1) {
            return;
          }
          __y_02._M_str = "Plane";
          __y_02._M_len = 5;
          bVar1 = std::operator==(type_name.name,__y_02);
          if (bVar1) {
            return;
          }
          __y_03._M_str = "Quaternion";
          __y_03._M_len = 10;
          bVar1 = std::operator==(type_name.name,__y_03);
          if (bVar1) {
            return;
          }
          __y_04._M_str = "Vector2";
          __y_04._M_len = 7;
          bVar1 = std::operator==(type_name.name,__y_04);
          if (bVar1) {
            return;
          }
          __y_05._M_str = "Vector3";
          __y_05._M_len = 7;
          bVar1 = std::operator==(type_name.name,__y_05);
          if (bVar1) {
            return;
          }
          __y_06._M_str = "Vector4";
          __y_06._M_len = 7;
          bVar1 = std::operator==(type_name.name,__y_06);
          if (bVar1) {
            return;
          }
        }
        winmd::reader::TypeDef::GenericParam(&generics,type);
        if ((generics.first.super_row_base<winmd::reader::GenericParam>.m_table ==
             generics.second.super_row_base<winmd::reader::GenericParam>.m_table) &&
           (generics.first.super_row_base<winmd::reader::GenericParam>.m_index ==
            generics.second.super_row_base<winmd::reader::GenericParam>.m_index)) {
          local_f8._0_8_ = (table_base *)0xe;
          local_f8._8_8_ = "    struct %;\n";
          writer_base<cppwinrt::writer>::
          write_segment<std::basic_string_view<char,std::char_traits<char>>>
                    (&w->super_writer_base<cppwinrt::writer>,(string_view *)local_f8,&type_name.name
                    );
        }
        else {
          local_f8._0_8_ = (table_base *)0x32;
          local_f8._8_8_ = "    template <%> struct WINRT_IMPL_EMPTY_BASES %;\n";
          local_100.args = &generics;
          local_d8 = remove_tick(&type_name.name);
          writer_base<cppwinrt::writer>::
          write_segment<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_std::basic_string_view<char,_std::char_traits<char>_>_>
                    (&w->super_writer_base<cppwinrt::writer>,(string_view *)local_f8,&local_100,
                     &local_d8);
        }
      }
    }
  }
  return;
}

Assistant:

static void write_forward(writer& w, TypeDef const& type)
    {
        type_name type_name(type);

        if (get_category(type) == category::enum_type)
        {
            auto format = R"(    enum class % : %;
)";

            w.write(format, type_name.name, type.FieldList().first.Signature().Type());
            return;
        }

        if (type_name == "Windows.Foundation.DateTime" ||
            type_name == "Windows.Foundation.TimeSpan")
        {
            // Don't forward declare these since they're not structs.
            return;
        }

        if (type_name.name_space == "Windows.Foundation.Numerics")
        {
            if (type_name.name == "Matrix3x2" ||
                type_name.name == "Matrix4x4" ||
                type_name.name == "Plane" ||
                type_name.name == "Quaternion" ||
                type_name.name == "Vector2" ||
                type_name.name == "Vector3" ||
                type_name.name == "Vector4")
            {
                // Don't forward declare these since they're already defined with different names.
                return;
            }
        }

        auto generics = type.GenericParam();

        if (empty(generics))
        {
            auto format = R"(    struct %;
)";

            w.write(format, type_name.name);
            return;
        }

        auto format = R"(    template <%> struct WINRT_IMPL_EMPTY_BASES %;
)";

        w.write(format,
            bind<write_generic_typenames>(generics),
            remove_tick(type_name.name));
    }